

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Panel.cpp
# Opt level: O0

BoardSize __thiscall Panel::checkBoardSize(Panel *this)

{
  iterator iVar1;
  iterator iVar2;
  pointer ppVar3;
  _Base_ptr local_18;
  _Rb_tree_iterator<std::pair<const_BoardSize,_std::unique_ptr<GraphicBoard,_std::default_delete<GraphicBoard>_>_>_>
  it;
  Panel *this_local;
  
  it._M_node = (_Base_ptr)this;
  iVar1 = std::
          map<BoardSize,_QRadioButton,_std::less<BoardSize>,_std::allocator<std::pair<const_BoardSize,_QRadioButton>_>_>
          ::begin(&this->radioSizeMap);
  iVar2 = std::
          map<BoardSize,_QRadioButton,_std::less<BoardSize>,_std::allocator<std::pair<const_BoardSize,_QRadioButton>_>_>
          ::end(&this->radioSizeMap);
  local_18 = (_Base_ptr)
             std::
             find_if<std::_Rb_tree_iterator<std::pair<BoardSize_const,QRadioButton>>,Panel::checkBoardSize()::__0>
                       (iVar1._M_node,iVar2._M_node);
  ppVar3 = std::_Rb_tree_iterator<std::pair<const_BoardSize,_QRadioButton>_>::operator->
                     ((_Rb_tree_iterator<std::pair<const_BoardSize,_QRadioButton>_> *)&local_18);
  return ppVar3->first;
}

Assistant:

BoardSize Panel::checkBoardSize()
{
    const auto it = std::find_if( radioSizeMap.begin(), radioSizeMap.end(), [] ( const auto& it ) { return it.second.isChecked(); });
    return it->first;
}